

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_ep_fini(void *arg)

{
  sfd_tran_ep *ep;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  nni_mtx_unlock((nni_mtx *)arg);
  nni_aio_stop((nni_aio *)((long)arg + 0xd0));
  nng_stream_listener_free(*(nng_stream_listener **)((long)arg + 0x2d0));
  nni_aio_fini((nni_aio *)((long)arg + 0xd0));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
sfd_tran_ep_fini(void *arg)
{
	sfd_tran_ep *ep = arg;

	nni_mtx_lock(&ep->mtx);
	nni_mtx_unlock(&ep->mtx);
	nni_aio_stop(&ep->connaio);
	nng_stream_listener_free(ep->listener);
	nni_aio_fini(&ep->connaio);

	nni_mtx_fini(&ep->mtx);
}